

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int w;
  long lVar5;
  long lVar6;
  long lVar7;
  secp256k1_gej *psVar8;
  secp256k1_fe *psVar9;
  secp256k1_ge *psVar10;
  uint64_t *puVar11;
  secp256k1_ge *psVar12;
  secp256k1_gej *in_R8;
  secp256k1_ge *psVar13;
  ulong uVar14;
  int *piVar15;
  bool bVar16;
  byte bVar17;
  undefined1 auStack_d58 [8];
  ulong local_d50;
  long local_d48;
  secp256k1_scalar *local_d40;
  secp256k1_fe *local_d38;
  secp256k1_gej *local_d30;
  secp256k1_ge local_d28;
  secp256k1_fe Z;
  uint64_t local_ca8;
  uint64_t uStack_ca0;
  undefined1 local_c98 [16];
  uint64_t local_c88;
  uint64_t uStack_c80;
  undefined1 local_c78 [16];
  int wnaf_ng_1 [129];
  secp256k1_fe aux [8];
  int wnaf_ng_128 [129];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  
  bVar17 = 0;
  Z.n[0] = 1;
  Z.n[1] = 0;
  Z.n[2] = 0;
  Z.n[3] = 0;
  Z.n[4] = 0;
  local_d38 = &a->z;
  bVar16 = true;
  local_d50 = 0;
  local_d48 = 0;
  local_d40 = ng;
  local_d30 = r;
  while (bVar16) {
    iVar1 = secp256k1_scalar_is_zero(na);
    w = (int)ng;
    if ((iVar1 == 0) && (a->infinity == 0)) {
      secp256k1_scalar_split_lambda
                ((secp256k1_scalar *)wnaf_ng_128,(secp256k1_scalar *)&local_d28,na);
      lVar7 = local_d48;
      ps[0].bits_na_1 =
           secp256k1_ecmult_wnaf(ps[local_d48].wnaf_na_1,(int)wnaf_ng_128,(secp256k1_scalar *)0x5,w)
      ;
      ps[0].bits_na_lam =
           secp256k1_ecmult_wnaf(ps[lVar7].wnaf_na_lam,(int)&local_d28,(secp256k1_scalar *)0x5,w);
      uVar4 = (uint)local_d50;
      if ((int)(uint)local_d50 < ps[0].bits_na_1) {
        uVar4 = ps[0].bits_na_1;
      }
      if ((int)uVar4 < ps[0].bits_na_lam) {
        uVar4 = ps[0].bits_na_lam;
      }
      local_d50 = (ulong)uVar4;
      psVar8 = a;
      puVar11 = (uint64_t *)wnaf_ng_1;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar11 = (psVar8->x).n[0];
        psVar8 = (secp256k1_gej *)((long)psVar8 + (ulong)bVar17 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
      }
      if (lVar7 != 0) {
        secp256k1_gej_rescale((secp256k1_gej *)wnaf_ng_1,&Z);
      }
      lVar7 = local_d48;
      psVar13 = (secp256k1_ge *)(aux + local_d48 * 8);
      ng = (secp256k1_scalar *)wnaf_ng_1;
      secp256k1_ecmult_odd_multiples_table
                ((int)auStack_d58 + (int)local_d48 * 0x2c0 + 0xa60,psVar13,&Z,(secp256k1_fe *)ng,
                 in_R8);
      if (lVar7 != 0) {
        secp256k1_fe_mul((secp256k1_fe *)psVar13,(secp256k1_fe *)psVar13,local_d38);
      }
      local_d48 = local_d48 + 1;
    }
    bVar16 = false;
  }
  psVar13 = pre_a;
  psVar9 = aux;
  secp256k1_ge_table_set_globalz(local_d48 * 8,psVar13,psVar9);
  for (lVar7 = 0; lVar7 != local_d48; lVar7 = lVar7 + 1) {
    psVar10 = psVar13;
    for (lVar5 = 0; lVar5 != 0x140; lVar5 = lVar5 + 0x28) {
      secp256k1_fe_mul((secp256k1_fe *)((long)psVar9->n + lVar5),&psVar10->x,&secp256k1_const_beta);
      psVar10 = psVar10 + 1;
    }
    psVar9 = psVar9 + 8;
    psVar13 = psVar13 + 8;
  }
  if (local_d40 == (secp256k1_scalar *)0x0) {
    local_d38 = (secp256k1_fe *)((ulong)local_d38 & 0xffffffff00000000);
    local_d40 = (secp256k1_scalar *)0x0;
    uVar14 = local_d50;
  }
  else {
    local_c88 = local_d40->d[0];
    uStack_c80 = local_d40->d[1];
    local_c78 = (undefined1  [16])0x0;
    local_ca8 = local_d40->d[2];
    uStack_ca0 = local_d40->d[3];
    local_c98 = (undefined1  [16])0x0;
    uVar2 = secp256k1_ecmult_wnaf(wnaf_ng_1,(int)&local_c88,(secp256k1_scalar *)0xf,(int)ng);
    uVar3 = secp256k1_ecmult_wnaf(wnaf_ng_128,(int)&local_ca8,(secp256k1_scalar *)0xf,(int)ng);
    local_d38 = (secp256k1_fe *)CONCAT44(local_d38._4_4_,uVar2);
    uVar4 = (uint)local_d50;
    if ((int)(uint)local_d50 < (int)uVar2) {
      uVar4 = uVar2;
    }
    local_d40 = (secp256k1_scalar *)CONCAT44(local_d40._4_4_,uVar3);
    if ((int)uVar4 < (int)uVar3) {
      uVar4 = uVar3;
    }
    uVar14 = (ulong)uVar4;
  }
  psVar8 = local_d30;
  secp256k1_gej_set_infinity(local_d30);
  uVar14 = uVar14 & 0xffffffff;
  lVar7 = uVar14 * 4;
  while (iVar1 = (int)uVar14, 0 < iVar1) {
    local_d50 = uVar14 - 1;
    secp256k1_gej_double_var(psVar8,psVar8,(secp256k1_fe *)0x0);
    piVar15 = &ps[0].bits_na_lam;
    psVar13 = pre_a;
    psVar9 = aux;
    lVar5 = local_d48;
    while (psVar8 = local_d30, uVar14 = local_d50, bVar16 = lVar5 != 0, lVar5 = lVar5 + -1, bVar16)
    {
      if ((iVar1 <= piVar15[-1]) && (uVar4 = *(uint *)((long)piVar15 + lVar7 + -0x410), uVar4 != 0))
      {
        if ((int)uVar4 < 1) {
          psVar10 = psVar13 + (~uVar4 >> 1);
          psVar12 = &local_d28;
          for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
            (psVar12->x).n[0] = (psVar10->x).n[0];
            psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar17 * -0x10 + 8);
            psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar17 * -0x10 + 8);
          }
          local_d28.y.n[0] = 0x3ffffbfffff0bc - local_d28.y.n[0];
          local_d28.y.n[1] = 0x3ffffffffffffc - local_d28.y.n[1];
          local_d28.y.n[2] = 0x3ffffffffffffc - local_d28.y.n[2];
          local_d28.y.n[3] = 0x3ffffffffffffc - local_d28.y.n[3];
          local_d28.y.n[4] = 0x3fffffffffffc - local_d28.y.n[4];
        }
        else {
          psVar10 = psVar13 + (uVar4 - 1 >> 1);
          psVar12 = &local_d28;
          for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
            (psVar12->x).n[0] = (psVar10->x).n[0];
            psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar17 * -0x10 + 8);
            psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar17 * -0x10 + 8);
          }
        }
        ng = (secp256k1_scalar *)0x0;
        secp256k1_gej_add_ge_var(local_d30,local_d30,&local_d28,(secp256k1_fe *)0x0);
      }
      if ((iVar1 <= *piVar15) && (uVar4 = *(uint *)((long)piVar15 + lVar7 + -0x20c), uVar4 != 0)) {
        local_d28.infinity = 0;
        if ((int)uVar4 < 1) {
          uVar4 = ~uVar4 >> 1;
          local_d28.x.n[4] = psVar9[uVar4].n[4];
          local_d28.x.n[0] = psVar9[uVar4].n[0];
          local_d28.x.n[1] = psVar9[uVar4].n[1];
          local_d28.x.n[2] = psVar9[uVar4].n[2];
          local_d28.x.n[3] = (psVar9[uVar4].n + 2)[1];
          puVar11 = psVar13[uVar4].y.n + 2;
          local_d28.y.n[0] = 0x3ffffbfffff0bc - psVar13[uVar4].y.n[0];
          local_d28.y.n[1] = 0x3ffffffffffffc - psVar13[uVar4].y.n[1];
          local_d28.y.n[2] = 0x3ffffffffffffc - *puVar11;
          local_d28.y.n[3] = 0x3ffffffffffffc - puVar11[1];
          local_d28.y.n[4] = 0x3fffffffffffc - psVar13[uVar4].y.n[4];
        }
        else {
          uVar4 = uVar4 - 1 >> 1;
          local_d28.x.n[4] = psVar9[uVar4].n[4];
          local_d28.x.n[0] = psVar9[uVar4].n[0];
          local_d28.x.n[1] = psVar9[uVar4].n[1];
          local_d28.x.n[2] = psVar9[uVar4].n[2];
          local_d28.x.n[3] = (psVar9[uVar4].n + 2)[1];
          local_d28.y.n[4] = psVar13[uVar4].y.n[4];
          local_d28.y.n[0] = psVar13[uVar4].y.n[0];
          local_d28.y.n[1] = psVar13[uVar4].y.n[1];
          puVar11 = psVar13[uVar4].y.n + 2;
          local_d28.y.n[2] = *puVar11;
          local_d28.y.n[3] = puVar11[1];
        }
        ng = (secp256k1_scalar *)0x0;
        secp256k1_gej_add_ge_var(local_d30,local_d30,&local_d28,(secp256k1_fe *)0x0);
      }
      psVar9 = psVar9 + 8;
      psVar13 = psVar13 + 8;
      piVar15 = piVar15 + 0x104;
    }
    if ((iVar1 <= (int)local_d38) && (wnaf_ng_1[local_d50] != 0)) {
      secp256k1_ecmult_table_get_ge_storage(&local_d28,secp256k1_pre_g,wnaf_ng_1[local_d50],(int)ng)
      ;
      ng = (secp256k1_scalar *)&Z;
      secp256k1_gej_add_zinv_var(psVar8,psVar8,&local_d28,(secp256k1_fe *)ng);
    }
    if ((iVar1 <= (int)local_d40) && (wnaf_ng_128[uVar14] != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                (&local_d28,secp256k1_pre_g_128,wnaf_ng_128[uVar14],(int)ng);
      ng = (secp256k1_scalar *)&Z;
      secp256k1_gej_add_zinv_var(psVar8,psVar8,&local_d28,(secp256k1_fe *)ng);
    }
    lVar7 = lVar7 + -4;
  }
  if (psVar8->infinity == 0) {
    secp256k1_fe_mul(&psVar8->z,&psVar8->z,&Z);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}